

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> * __thiscall
kj::_::NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>>::
emplace<kj::Promise<kj::HttpServer::Connection::LoopResult>>
          (NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>> *this,
          Promise<kj::HttpServer::Connection::LoopResult> *params)

{
  if (*this == (NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>>)0x1) {
    *this = (NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>>)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(this + 8));
  }
  *(PromiseNode **)(this + 8) = (params->super_PromiseBase).node.ptr;
  (params->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  *this = (NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>>)0x1;
  return (Promise<kj::HttpServer::Connection::LoopResult> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }